

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int import_tls13_traffic_protection(ptls_t *tls,int is_enc,uint8_t **src,uint8_t *end)

{
  int iVar1;
  anon_struct_208_2_4e55c0bb_for_traffic_protection *local_40;
  st_ptls_traffic_protection_t *tp;
  uint8_t *end_local;
  uint8_t **src_local;
  int is_enc_local;
  ptls_t *tls_local;
  
  if (is_enc == 0) {
    local_40 = &tls->traffic_protection;
  }
  else {
    local_40 = (anon_struct_208_2_4e55c0bb_for_traffic_protection *)&(tls->traffic_protection).enc;
  }
  memcpy(local_40,*src,tls->cipher_suite->hash->digest_size);
  *src = *src + tls->cipher_suite->hash->digest_size;
  iVar1 = ptls_decode64(&(local_40->dec).seq,src,end);
  if (iVar1 == 0) {
    iVar1 = setup_traffic_protection(tls,is_enc,(char *)0x0,3,(local_40->dec).seq,0);
    if (iVar1 == 0) {
      tls_local._4_4_ = 0;
    }
    else {
      tls_local._4_4_ = 0x204;
    }
  }
  else {
    tls_local._4_4_ = 0x32;
  }
  return tls_local._4_4_;
}

Assistant:

static int import_tls13_traffic_protection(ptls_t *tls, int is_enc, const uint8_t **src, const uint8_t *const end)
{
    struct st_ptls_traffic_protection_t *tp = is_enc ? &tls->traffic_protection.enc : &tls->traffic_protection.dec;

    /* set properties */
    memcpy(tp->secret, *src, tls->cipher_suite->hash->digest_size);
    *src += tls->cipher_suite->hash->digest_size;
    if (ptls_decode64(&tp->seq, src, end) != 0)
        return PTLS_ALERT_DECODE_ERROR;

    if (setup_traffic_protection(tls, is_enc, NULL, 3, tp->seq, 0) != 0)
        return PTLS_ERROR_INCOMPATIBLE_KEY;

    return 0;
}